

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

size_t __thiscall
kj::ArrayInputStream::tryRead(ArrayInputStream *this,void *dst,size_t minBytes,size_t maxBytes)

{
  size_t start;
  unsigned_long *puVar1;
  uchar *__src;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  uchar *local_48;
  size_t local_40;
  size_t local_38;
  size_t local_30;
  size_t n;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *dst_local;
  ArrayInputStream *this_local;
  
  n = maxBytes;
  maxBytes_local = minBytes;
  minBytes_local = (size_t)dst;
  dst_local = this;
  local_38 = ArrayPtr<const_unsigned_char>::size(&this->array);
  puVar1 = std::min<unsigned_long>(&n,&local_38);
  sVar2 = minBytes_local;
  local_30 = *puVar1;
  __src = ArrayPtr<const_unsigned_char>::begin(&this->array);
  memcpy((void *)sVar2,__src,local_30);
  start = local_30;
  sVar2 = ArrayPtr<const_unsigned_char>::size(&this->array);
  AVar3 = ArrayPtr<const_unsigned_char>::slice(&this->array,start,sVar2);
  local_48 = AVar3.ptr;
  (this->array).ptr = local_48;
  local_40 = AVar3.size_;
  (this->array).size_ = local_40;
  return local_30;
}

Assistant:

size_t ArrayInputStream::tryRead(void* dst, size_t minBytes, size_t maxBytes) {
  size_t n = std::min(maxBytes, array.size());
  memcpy(dst, array.begin(), n);
  array = array.slice(n, array.size());
  return n;
}